

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
as_string<std::allocator<char>>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,basic_json<char,jsoncons::sorted_policy,std::allocator<char>> *this,
          allocator<char> *alloc)

{
  semantic_tag tag;
  ser_error *this_00;
  error_code ec_00;
  string_view_type sVar1;
  string_view_type sVar2;
  allocator<char> local_1a9;
  value_converter<jsoncons::byte_string_view,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  converter;
  error_code ec;
  basic_compact_json_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
  encoder;
  
  ec._M_value = 0;
  ec._M_cat = (error_category *)std::_V2::system_category();
  _converter = __return_storage_ptr__;
  switch((byte)*this & 0xf) {
  case 7:
  case 0xf:
    sVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::as_string_view
                      ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this);
    sVar2 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::as_string_view
                      ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,sVar1._M_str,sVar1._M_str + sVar2._M_len);
    break;
  case 8:
  case 9:
    as_string<std::allocator<char>>
              (__return_storage_ptr__,
               *(basic_json<char,jsoncons::sorted_policy,std::allocator<char>> **)(this + 8),alloc);
    break;
  default:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    basic_compact_json_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
    ::basic_compact_json_encoder
              (&encoder,(string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&converter,&local_1a9);
    basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::dump
              ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,
               &encoder.super_basic_json_visitor<char>);
    goto LAB_001d347b;
  case 0xc:
    basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::as_byte_string_view
              ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)&encoder);
    tag = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::tag
                    ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this);
    value_converter<jsoncons::byte_string_view,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
    ::convert<char>(__return_storage_ptr__,&converter,(byte_string_view *)&encoder,tag,&ec);
    if (ec._M_value != 0) {
      this_00 = (ser_error *)__cxa_allocate_exception(0x58);
      ec_00._4_4_ = 0;
      ec_00._M_value = ec._M_value;
      ec_00._M_cat = ec._M_cat;
      ser_error::ser_error(this_00,ec_00);
      __cxa_throw(this_00,&ser_error::typeinfo,ser_error::~ser_error);
    }
    break;
  case 0xe:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    basic_compact_json_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
    ::basic_compact_json_encoder
              (&encoder,(string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&converter,&local_1a9);
    basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::dump
              ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this,
               &encoder.super_basic_json_visitor<char>);
LAB_001d347b:
    basic_compact_json_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
    ::~basic_compact_json_encoder(&encoder);
  }
  return __return_storage_ptr__;
}

Assistant:

std::basic_string<char_type,char_traits_type,SAllocator> as_string(const SAllocator& alloc) const 
        {
            using string_type2 = std::basic_string<char_type,char_traits_type,SAllocator>;

            std::error_code ec;
            switch (storage_kind())
            {
                case json_storage_kind::short_str:
                case json_storage_kind::long_str:
                {
                    return string_type2(as_string_view().data(),as_string_view().length(),alloc);
                }
                case json_storage_kind::byte_str:
                {
                    value_converter<byte_string_view,string_type2> converter;
                    auto s = converter.convert(as_byte_string_view(), tag(), ec);
                    if (JSONCONS_UNLIKELY(ec))
                    {
                        JSONCONS_THROW(ser_error(ec));
                    }
                    return s;
                }
                case json_storage_kind::array:
                {
                    string_type2 s(alloc);
                    {
                        basic_compact_json_encoder<char_type,jsoncons::string_sink<string_type2>> encoder(s);
                        dump(encoder);
                    }
                    return s;
                }
                case json_storage_kind::json_const_reference:
                    return cast<json_const_reference_storage>().value().as_string(alloc);
                case json_storage_kind::json_reference:
                    return cast<json_reference_storage>().value().as_string(alloc);
                default:
                {
                    string_type2 s(alloc);
                    basic_compact_json_encoder<char_type,jsoncons::string_sink<string_type2>> encoder(s);
                    dump(encoder);
                    return s;
                }
            }
        }